

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetSourceFilesPropertiesCommand.cxx
# Opt level: O1

bool cmSetSourceFilesPropertiesCommand::RunCommand
               (cmMakefile *mf,const_iterator filebeg,const_iterator fileend,const_iterator propbeg,
               const_iterator propend,string *errors)

{
  value_type *__x;
  bool bVar1;
  int iVar2;
  cmSourceFile *this;
  char *pcVar3;
  string *val;
  ulong uVar4;
  uint uVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  propertyPairs;
  bool local_6c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  string *local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  cmMakefile *local_38;
  
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48 = errors;
  local_40 = fileend._M_current;
  local_38 = mf;
  if (propbeg._M_current == propend._M_current) {
    local_6c = false;
  }
  else {
    local_6c = false;
    do {
      iVar2 = std::__cxx11::string::compare((char *)propbeg._M_current);
      if (iVar2 == 0) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[9]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_68,
                   (char (*) [9])"ABSTRACT");
LAB_002f08fa:
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[2]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_68,
                   (char (*) [2])0x58c478);
      }
      else {
        iVar2 = std::__cxx11::string::compare((char *)propbeg._M_current);
        if (iVar2 == 0) {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[13]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_68,
                     (char (*) [13])"WRAP_EXCLUDE");
          goto LAB_002f08fa;
        }
        iVar2 = std::__cxx11::string::compare((char *)propbeg._M_current);
        if (iVar2 != 0) {
          iVar2 = std::__cxx11::string::compare((char *)propbeg._M_current);
          if (iVar2 == 0) {
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<char_const(&)[14]>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_68,(char (*) [14])0x543a69);
            propbeg._M_current = propbeg._M_current + 1;
            if (propbeg._M_current != propend._M_current) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(&local_68,propbeg._M_current);
              goto LAB_002f0909;
            }
            pcVar3 = "called with incorrect number of arguments COMPILE_FLAGS with no flags";
          }
          else {
            iVar2 = std::__cxx11::string::compare((char *)propbeg._M_current);
            if (iVar2 == 0) {
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<char_const(&)[15]>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &local_68,(char (*) [15])"OBJECT_DEPENDS");
              propbeg._M_current = propbeg._M_current + 1;
              if (propbeg._M_current != propend._M_current) {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back(&local_68,propbeg._M_current);
                goto LAB_002f0909;
              }
              pcVar3 = 
              "called with incorrect number of arguments OBJECT_DEPENDS with no dependencies";
            }
            else {
              iVar2 = std::__cxx11::string::compare((char *)propbeg._M_current);
              if (iVar2 == 0) {
                goto LAB_002f0a6c;
              }
              pcVar3 = "called with illegal arguments, maybe missing a PROPERTIES specifier?";
            }
          }
          bVar1 = false;
          std::__cxx11::string::_M_replace
                    ((ulong)local_48,0,(char *)local_48->_M_string_length,(ulong)pcVar3);
          goto LAB_002f0a40;
        }
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[10]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_68,
                   (char (*) [10])"GENERATED");
        local_6c = true;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[2]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_68,
                   (char (*) [2])0x58c478);
      }
LAB_002f0909:
      propbeg._M_current = propbeg._M_current + 1;
    } while (propbeg._M_current != propend._M_current);
  }
LAB_002f0967:
  bVar1 = true;
  if (filebeg._M_current != local_40) {
    do {
      this = cmMakefile::GetOrCreateSource(local_38,filebeg._M_current,local_6c,Ambiguous);
      if ((this != (cmSourceFile *)0x0) &&
         (local_68.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_68.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start)) {
        uVar5 = 2;
        uVar4 = 0;
        do {
          cmSourceFile::SetProperty
                    (this,local_68.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar4,
                     local_68.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar5 - 1]._M_dataplus._M_p);
          uVar4 = (ulong)uVar5;
          uVar5 = uVar5 + 2;
        } while (uVar4 < (ulong)((long)local_68.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_68.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 5));
      }
      filebeg._M_current = filebeg._M_current + 1;
    } while (filebeg._M_current != local_40);
  }
LAB_002f0a40:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_68);
  return bVar1;
LAB_002f0a6c:
  val = propbeg._M_current + 2;
  __x = propbeg._M_current + 1;
  if (__x == propend._M_current) goto LAB_002f0967;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_68,__x);
  iVar2 = std::__cxx11::string::compare((char *)__x);
  if (val != propend._M_current && iVar2 == 0) {
    bVar1 = cmSystemTools::IsOn(val);
    if (bVar1) {
      local_6c = true;
    }
  }
  if (val == propend._M_current) {
    std::__cxx11::string::operator=((string *)local_48,"called with incorrect number of arguments.")
    ;
    bVar1 = false;
    goto LAB_002f0a40;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_68,val);
  propbeg._M_current = val;
  goto LAB_002f0a6c;
}

Assistant:

bool cmSetSourceFilesPropertiesCommand::RunCommand(
  cmMakefile* mf, std::vector<std::string>::const_iterator filebeg,
  std::vector<std::string>::const_iterator fileend,
  std::vector<std::string>::const_iterator propbeg,
  std::vector<std::string>::const_iterator propend, std::string& errors)
{
  std::vector<std::string> propertyPairs;
  bool generated = false;
  std::vector<std::string>::const_iterator j;
  // build the property pairs
  for (j = propbeg; j != propend; ++j) {
    // old style allows for specifier before PROPERTIES keyword
    if (*j == "ABSTRACT") {
      propertyPairs.emplace_back("ABSTRACT");
      propertyPairs.emplace_back("1");
    } else if (*j == "WRAP_EXCLUDE") {
      propertyPairs.emplace_back("WRAP_EXCLUDE");
      propertyPairs.emplace_back("1");
    } else if (*j == "GENERATED") {
      generated = true;
      propertyPairs.emplace_back("GENERATED");
      propertyPairs.emplace_back("1");
    } else if (*j == "COMPILE_FLAGS") {
      propertyPairs.emplace_back("COMPILE_FLAGS");
      ++j;
      if (j == propend) {
        errors = "called with incorrect number of arguments "
                 "COMPILE_FLAGS with no flags";
        return false;
      }
      propertyPairs.push_back(*j);
    } else if (*j == "OBJECT_DEPENDS") {
      propertyPairs.emplace_back("OBJECT_DEPENDS");
      ++j;
      if (j == propend) {
        errors = "called with incorrect number of arguments "
                 "OBJECT_DEPENDS with no dependencies";
        return false;
      }
      propertyPairs.push_back(*j);
    } else if (*j == "PROPERTIES") {
      // now loop through the rest of the arguments, new style
      ++j;
      while (j != propend) {
        propertyPairs.push_back(*j);
        if (*j == "GENERATED") {
          ++j;
          if (j != propend && cmSystemTools::IsOn(*j)) {
            generated = true;
          }
        } else {
          ++j;
        }
        if (j == propend) {
          errors = "called with incorrect number of arguments.";
          return false;
        }
        propertyPairs.push_back(*j);
        ++j;
      }
      // break out of the loop because j is already == end
      break;
    } else {
      errors = "called with illegal arguments, maybe missing a "
               "PROPERTIES specifier?";
      return false;
    }
  }

  // now loop over all the files
  for (j = filebeg; j != fileend; ++j) {
    // get the source file
    cmSourceFile* sf = mf->GetOrCreateSource(*j, generated);
    if (sf) {
      // now loop through all the props and set them
      unsigned int k;
      for (k = 0; k < propertyPairs.size(); k = k + 2) {
        sf->SetProperty(propertyPairs[k], propertyPairs[k + 1].c_str());
      }
    }
  }
  return true;
}